

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O1

double * __thiscall
google::protobuf::internal::GeneratedMessageReflection::GetRaw<double>
          (GeneratedMessageReflection *this,Message *message,FieldDescriptor *field)

{
  long lVar1;
  uint32 uVar2;
  double *pdVar3;
  
  lVar1 = *(long *)(field + 0x60);
  if ((lVar1 != 0) &&
     (*(int *)((long)&(message->super_MessageLite)._vptr_MessageLite +
              (ulong)(uint)((int)((ulong)(lVar1 - *(long *)(*(long *)(lVar1 + 0x10) + 0x40)) >> 4) *
                            -0x55555554 + (this->schema_).oneof_case_offset_)) !=
      *(int *)(field + 0x38))) {
    pdVar3 = (double *)ReflectionSchema::GetFieldDefault(&this->schema_,field);
    return pdVar3;
  }
  uVar2 = ReflectionSchema::GetFieldOffset(&this->schema_,field);
  return (double *)((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar2);
}

Assistant:

const Type& GeneratedMessageReflection::GetRaw(
    const Message& message, const FieldDescriptor* field) const {
  if (field->containing_oneof() && !HasOneofField(message, field)) {
    return DefaultRaw<Type>(field);
  }
  return GetConstRefAtOffset<Type>(message, schema_.GetFieldOffset(field));
}